

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed_change.c
# Opt level: O0

int speed_segment_get(uint32_t field,void *value,mixed_segment *segment)

{
  speed_segment_data *data;
  mixed_segment *segment_local;
  void *value_local;
  uint32_t field_local;
  
  if (field == 1) {
    *(bool *)value = segment->mix == speed_segment_mix_bypass;
  }
  else {
    if (field != 0x27) {
      mixed_err(7);
      return 0;
    }
    *(undefined8 *)value = *(undefined8 *)((long)segment->data + 0x18);
  }
  return 1;
}

Assistant:

int speed_segment_get(uint32_t field, void *value, struct mixed_segment *segment){
  struct speed_segment_data *data = (struct speed_segment_data *)segment->data;
  switch(field){
  case MIXED_SPEED_FACTOR: *((double *)value) = data->speed; break;
  case MIXED_BYPASS: *((bool *)value) = (segment->mix == speed_segment_mix_bypass); break;
  default: mixed_err(MIXED_INVALID_FIELD); return 0;
  }
  return 1;
}